

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::AddWithoutInterpreting
          (OptionInterpreter *this,UninterpretedOption *uninterpreted_option,Message *options)

{
  Descriptor *this_00;
  LogMessage *pLVar1;
  Reflection *this_01;
  Message *this_02;
  LogMessage local_50;
  Voidify local_39;
  string_view local_38;
  FieldDescriptor *local_28;
  FieldDescriptor *field;
  Message *options_local;
  UninterpretedOption *uninterpreted_option_local;
  OptionInterpreter *this_local;
  
  field = (FieldDescriptor *)options;
  options_local = &uninterpreted_option->super_Message;
  uninterpreted_option_local = (UninterpretedOption *)this;
  this_00 = Message::GetDescriptor(options);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_38,"uninterpreted_option");
  local_28 = Descriptor::FindFieldByName(this_00,local_38);
  if (local_28 != (FieldDescriptor *)0x0) {
    this_01 = Message::GetReflection((Message *)field);
    this_02 = Reflection::AddMessage(this_01,(Message *)field,local_28,(MessageFactory *)0x0);
    Message::CopyFrom(this_02,options_local);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
             ,0x263b,"field != nullptr");
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar1);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_50);
}

Assistant:

void DescriptorBuilder::OptionInterpreter::AddWithoutInterpreting(
    const UninterpretedOption& uninterpreted_option, Message* options) {
  const FieldDescriptor* field =
      options->GetDescriptor()->FindFieldByName("uninterpreted_option");
  ABSL_CHECK(field != nullptr);

  options->GetReflection()
      ->AddMessage(options, field)
      ->CopyFrom(uninterpreted_option);
}